

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_acl_text(archive_entry *entry,wchar_t flags)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t local_14;
  archive_entry *paStack_10;
  wchar_t flags_local;
  archive_entry *entry_local;
  
  local_14 = flags;
  paStack_10 = entry;
  free((entry->acl).acl_text);
  (paStack_10->acl).acl_text = (char *)0x0;
  wVar1 = archive_entry_acl_text_compat(&local_14);
  if (wVar1 == L'\0') {
    pcVar2 = archive_acl_to_text_l
                       (&paStack_10->acl,(ssize_t *)0x0,local_14,(archive_string_conv *)0x0);
    (paStack_10->acl).acl_text = pcVar2;
  }
  return (paStack_10->acl).acl_text;
}

Assistant:

const char *
archive_entry_acl_text(struct archive_entry *entry, int flags)
{
	free(entry->acl.acl_text);
	entry->acl.acl_text = NULL;
	if (archive_entry_acl_text_compat(&flags) == 0)
		entry->acl.acl_text = archive_acl_to_text_l(&entry->acl, NULL,
		    flags, NULL);

	return (entry->acl.acl_text);
}